

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  short sVar6;
  uint uVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiWindow *pIVar10;
  byte bVar11;
  ImVec2 IVar12;
  char cVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  ImGuiWindow *pIVar17;
  ImGuiWindow *pIVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  
  pIVar9 = GImGui;
  pIVar18 = GImGui->MovingWindow;
  pIVar17 = (ImGuiWindow *)0x0;
  if ((pIVar18 != (ImGuiWindow *)0x0) && ((pIVar18->Flags & 0x200) == 0)) {
    pIVar17 = pIVar18;
  }
  pIVar1 = &(GImGui->Style).TouchExtraPadding;
  IVar12 = *pIVar1;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar20._8_8_ = 0;
    auVar20._0_4_ = (GImGui->Style).TouchExtraPadding.x;
    auVar20._4_4_ = (GImGui->Style).TouchExtraPadding.y;
    auVar20 = maxps(auVar20,_DAT_00180fe0);
    IVar12 = auVar20._0_8_;
  }
  lVar14 = (long)(GImGui->Windows).Size;
  if (lVar14 < 1) {
    pIVar10 = (ImGuiWindow *)0x0;
  }
  else {
    lVar14 = lVar14 + 1;
    pIVar10 = (ImGuiWindow *)0x0;
    do {
      pIVar8 = (GImGui->Windows).Data[lVar14 + -2];
      bVar19 = false;
      if (((pIVar8->Active == true) && (pIVar8->Hidden == false)) &&
         (uVar7 = pIVar8->Flags, (uVar7 >> 9 & 1) == 0)) {
        fVar21 = pIVar1->x;
        if ((uVar7 & 0x1000042) == 0) {
          fVar21 = IVar12.x;
        }
        fVar3 = (GImGui->IO).MousePos.x;
        if ((pIVar8->OuterRectClipped).Min.x - fVar21 <= fVar3) {
          fVar22 = (GImGui->Style).TouchExtraPadding.y;
          if ((uVar7 & 0x1000042) == 0) {
            fVar22 = IVar12.y;
          }
          fVar4 = (GImGui->IO).MousePos.y;
          if ((((pIVar8->OuterRectClipped).Min.y - fVar22 <= fVar4) &&
              (fVar3 < fVar21 + (pIVar8->OuterRectClipped).Max.x)) &&
             (fVar4 < fVar22 + (pIVar8->OuterRectClipped).Max.y)) {
            sVar6 = (pIVar8->HitTestHoleSize).x;
            if (sVar6 != 0) {
              fVar21 = (float)(int)(pIVar8->HitTestHoleOffset).x + (pIVar8->Pos).x;
              if (fVar21 <= fVar3) {
                fVar22 = (float)(int)(pIVar8->HitTestHoleOffset).y + (pIVar8->Pos).y;
                bVar19 = (fVar4 < (float)(int)(pIVar8->HitTestHoleSize).y + fVar22 &&
                         fVar3 < fVar21 + (float)(int)sVar6) && fVar22 <= fVar4;
              }
              else {
                bVar19 = false;
              }
              if (bVar19) {
                bVar19 = false;
                goto LAB_0012d149;
              }
            }
            if (pIVar17 == (ImGuiWindow *)0x0) {
              pIVar17 = pIVar8;
            }
            if (((pIVar10 == (ImGuiWindow *)0x0) &&
                (pIVar10 = pIVar8, pIVar18 != (ImGuiWindow *)0x0)) &&
               (pIVar8->RootWindow == pIVar18->RootWindow)) {
              pIVar10 = (ImGuiWindow *)0x0;
            }
            bVar19 = pIVar10 != (ImGuiWindow *)0x0 && pIVar17 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_0012d149:
    } while ((!bVar19) && (lVar14 = lVar14 + -1, 1 < lVar14));
  }
  GImGui->HoveredWindow = pIVar17;
  if (pIVar17 == (ImGuiWindow *)0x0) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = pIVar17->RootWindow;
  }
  pIVar9->HoveredRootWindow = pIVar18;
  pIVar9->HoveredWindowUnderMovingWindow = pIVar10;
  pIVar10 = GetTopMostPopupModal();
  bVar19 = false;
  if ((pIVar10 != (ImGuiWindow *)0x0) && (bVar19 = false, pIVar18 != (ImGuiWindow *)0x0)) {
    if (pIVar18->RootWindow == pIVar10) {
      bVar19 = false;
    }
    else {
      do {
        bVar19 = pIVar18 == pIVar10;
        if (bVar19) goto LAB_0012d1b7;
        pIVar18 = pIVar18->ParentWindow;
      } while (pIVar18 != (ImGuiWindow *)0x0);
      bVar19 = false;
LAB_0012d1b7:
      bVar19 = (bool)(bVar19 ^ 1);
    }
  }
  uVar7 = (pIVar9->IO).ConfigFlags;
  iVar15 = -1;
  lVar14 = 0;
  bVar11 = 0;
  do {
    if ((pIVar9->IO).MouseClicked[lVar14] == true) {
      bVar16 = true;
      if (pIVar17 == (ImGuiWindow *)0x0) {
        bVar16 = 0 < (pIVar9->OpenPopupStack).Size;
      }
      (pIVar9->IO).MouseDownOwned[lVar14] = bVar16;
    }
    bVar16 = (pIVar9->IO).MouseDown[lVar14];
    if ((bVar16 == true) &&
       ((iVar15 == -1 ||
        (dVar5 = (pIVar9->IO).MouseClickedTime[iVar15],
        pdVar2 = (pIVar9->IO).MouseClickedTime + lVar14, *pdVar2 <= dVar5 && dVar5 != *pdVar2)))) {
      iVar15 = (int)lVar14;
    }
    bVar11 = bVar11 & 1 | bVar16;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  bVar16 = true;
  if ((uVar7 & 0x10) == 0) {
    bVar16 = bVar19;
  }
  cVar13 = '\x01';
  if (iVar15 != -1) {
    cVar13 = (pIVar9->IO).MouseDownOwned[iVar15];
  }
  bVar19 = true;
  if ((pIVar9->DragDropActive == true) && (bVar19 = true, (pIVar9->DragDropSourceFlags & 0x10) != 0)
     ) {
    bVar19 = bVar16;
  }
  if (cVar13 != '\0') {
    bVar19 = bVar16;
  }
  if (bVar19) {
    pIVar9->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar9->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar9->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar9->WantCaptureMouseNextFrame == -1) {
    if ((cVar13 == '\0') ||
       ((bVar19 = true, pIVar9->HoveredWindow == (ImGuiWindow *)0x0 && (bVar11 == 0)))) {
      bVar19 = 0 < (pIVar9->OpenPopupStack).Size;
    }
    (pIVar9->IO).WantCaptureMouse = bVar19;
  }
  else {
    (pIVar9->IO).WantCaptureMouse = pIVar9->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar9->WantCaptureKeyboardNextFrame == -1) {
    bVar19 = pIVar9->ActiveId != 0 || pIVar10 != (ImGuiWindow *)0x0;
  }
  else {
    bVar19 = pIVar9->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar9->IO).WantCaptureKeyboard = bVar19;
  if (((uVar7 & 9) == 1 & (pIVar9->IO).NavActive) == 1) {
    (pIVar9->IO).WantCaptureKeyboard = true;
  }
  (pIVar9->IO).WantTextInput = pIVar9->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}